

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

int Io_BlifGetLine(Io_BlifMan_t *p,char *pToken)

{
  int iVar1;
  char *pcVar2;
  int local_2c;
  int i;
  char *pLine;
  char *pToken_local;
  Io_BlifMan_t *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vLines);
    if (iVar1 <= local_2c) {
      return -1;
    }
    pcVar2 = (char *)Vec_PtrEntry(p->vLines,local_2c);
    if (pToken < pcVar2) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

static int Io_BlifGetLine( Io_BlifMan_t * p, char * pToken )
{
    char * pLine;
    int i;
    Vec_PtrForEachEntry( char *, p->vLines, pLine, i )
        if ( pToken < pLine )
            return i;
    return -1;
}